

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsFloatOrParam::setParamValue
          (KinematicsFloatOrParam *this,String *paramValue)

{
  String *this_00;
  
  deleteParam(this);
  this_00 = (String *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)paramValue);
  (this->mValue)._param = this_00;
  this->mValueType = VALUETYPE_PARAM;
  return;
}

Assistant:

void setParamValue( const String& paramValue) { deleteParam(); mValue._param = new String(paramValue); mValueType = VALUETYPE_PARAM; }